

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fxuMatrix.c
# Opt level: O0

Fxu_Cube * Fxu_MatrixAddCube(Fxu_Matrix *p,Fxu_Var *pVar,int iCube)

{
  Fxu_Cube *pLink;
  Fxu_Cube *pCube;
  int iCube_local;
  Fxu_Var *pVar_local;
  Fxu_Matrix *p_local;
  
  pLink = (Fxu_Cube *)Fxu_MemFetch(p,0x48);
  memset(pLink,0,0x48);
  pLink->pVar = pVar;
  pLink->iCube = iCube;
  Fxu_ListMatrixAddCube(p,pLink);
  return pLink;
}

Assistant:

Fxu_Cube * Fxu_MatrixAddCube( Fxu_Matrix * p, Fxu_Var * pVar, int iCube )
{
	Fxu_Cube * pCube;
	pCube = MEM_ALLOC_FXU( p, Fxu_Cube, 1 );
	memset( pCube, 0, sizeof(Fxu_Cube) );
	pCube->pVar  = pVar;
	pCube->iCube = iCube;
	Fxu_ListMatrixAddCube( p, pCube );
	return pCube;
}